

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O1

int lws_server_init_wsi_for_ws(lws *wsi)

{
  _lws_websocket_related *p_Var1;
  lws_callback_function *plVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  
  lwsi_set_state(wsi,0x119);
  uVar3 = (uint)wsi->protocol->rx_buffer_size;
  if (uVar3 == 0) {
    uVar3 = wsi->context->pt_serv_buf_size;
  }
  puVar5 = (uchar *)lws_realloc((void *)0x0,(long)(int)(uVar3 + 0x14),"rx_ubuf");
  p_Var1 = wsi->ws;
  p_Var1->rx_ubuf = puVar5;
  if (puVar5 == (uchar *)0x0) {
    iVar4 = 1;
    _lws_log(1,"Out of Mem allocating rx buffer %d\n",(ulong)(uVar3 + 0x10));
  }
  else {
    p_Var1->rx_ubuf_alloc = uVar3 + 0x10;
    plVar2 = wsi->protocol->callback;
    if ((plVar2 != (lws_callback_function *)0x0) &&
       (iVar4 = (*plVar2)(wsi,LWS_CALLBACK_ESTABLISHED,wsi->user_space,(wsi->tls).ssl,0), iVar4 != 0
       )) {
      return 1;
    }
    lws_validity_confirmed(wsi);
    iVar4 = 0;
    _lws_log(0x10,"ws established\n");
  }
  return iVar4;
}

Assistant:

int
lws_server_init_wsi_for_ws(struct lws *wsi)
{
	int n;

	lwsi_set_state(wsi, LRS_ESTABLISHED);

	/*
	 * create the frame buffer for this connection according to the
	 * size mentioned in the protocol definition.  If 0 there, use
	 * a big default for compatibility
	 */

	n = (int)wsi->protocol->rx_buffer_size;
	if (!n)
		n = wsi->context->pt_serv_buf_size;
	n += LWS_PRE;
	wsi->ws->rx_ubuf = lws_malloc(n + 4 /* 0x0000ffff zlib */, "rx_ubuf");
	if (!wsi->ws->rx_ubuf) {
		lwsl_err("Out of Mem allocating rx buffer %d\n", n);
		return 1;
	}
	wsi->ws->rx_ubuf_alloc = n;

	/* notify user code that we're ready to roll */

	if (wsi->protocol->callback)
		if (wsi->protocol->callback(wsi, LWS_CALLBACK_ESTABLISHED,
					    wsi->user_space,
#ifdef LWS_WITH_TLS
					    wsi->tls.ssl,
#else
					    NULL,
#endif
					    wsi->h2_stream_carries_ws))
			return 1;

	lws_validity_confirmed(wsi);
	lwsl_debug("ws established\n");

	return 0;
}